

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidgetitemiterator.cpp
# Opt level: O3

void __thiscall
QTreeWidgetItemIterator::QTreeWidgetItemIterator
          (QTreeWidgetItemIterator *this,QTreeWidgetItem *item,IteratorFlags flags)

{
  long *plVar1;
  QTreeWidgetItem *pQVar2;
  bool bVar3;
  QTreeWidgetItemIteratorPrivate *pQVar4;
  QTreeModel *pQVar5;
  long lVar6;
  int iVar7;
  QTreeWidgetItem *pQVar8;
  long lVar9;
  QTreeWidgetItem *pQVar10;
  QTreeWidgetItem *this_00;
  QTreeWidgetItem *itm;
  long in_FS_OFFSET;
  QTreeWidgetItemIterator *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = (QTreeWidgetItemIteratorPrivate *)operator_new(0x30);
  QAbstractItemView::model((QAbstractItemView *)item->view);
  pQVar5 = (QTreeModel *)QMetaObject::cast((QObject *)&QTreeModel::staticMetaObject);
  pQVar4->m_currentIndex = 0;
  pQVar4->m_model = pQVar5;
  (pQVar4->m_parentIndex).super_QList<int>.d.d = (Data *)0x0;
  (pQVar4->m_parentIndex).super_QList<int>.d.ptr = (int *)0x0;
  (pQVar4->m_parentIndex).super_QList<int>.d.size = 0;
  pQVar4->q_ptr = this;
  (this->d_ptr).d = pQVar4;
  this->current = item;
  (this->flags).super_QFlagsStorageHelper<QTreeWidgetItemIterator::IteratorFlag,_4>.
  super_QFlagsStorage<QTreeWidgetItemIterator::IteratorFlag>.i =
       (Int)flags.super_QFlagsStorageHelper<QTreeWidgetItemIterator::IteratorFlag,_4>.
            super_QFlagsStorage<QTreeWidgetItemIterator::IteratorFlag>.i;
  QAbstractItemView::model((QAbstractItemView *)item->view);
  lVar6 = QMetaObject::cast((QObject *)&QTreeModel::staticMetaObject);
  local_40 = this;
  QtPrivate::QPodArrayOps<QTreeWidgetItemIterator*>::emplace<QTreeWidgetItemIterator*&>
            ((QPodArrayOps<QTreeWidgetItemIterator*> *)(lVar6 + 0x38),*(qsizetype *)(lVar6 + 0x48),
             &local_40);
  QList<QTreeWidgetItemIterator_*>::end((QList<QTreeWidgetItemIterator_*> *)(lVar6 + 0x38));
  pQVar8 = item->par;
  pQVar2 = pQVar4->m_model->rootItem;
  pQVar10 = pQVar8;
  if (pQVar8 == (QTreeWidgetItem *)0x0) {
    pQVar10 = pQVar2;
  }
  QTreeWidgetItem::executePendingSort(pQVar10);
  lVar6 = (pQVar10->children).d.size;
  if (lVar6 == 0) {
LAB_005bab1f:
    iVar7 = -1;
  }
  else {
    iVar7 = -1;
    lVar9 = 0;
    do {
      if (lVar6 << 3 == lVar9) goto LAB_005bab1f;
      iVar7 = iVar7 + 1;
      plVar1 = (long *)((long)(pQVar10->children).d.ptr + lVar9);
      lVar9 = lVar9 + 8;
    } while ((QTreeWidgetItem *)*plVar1 != item);
  }
  pQVar4->m_currentIndex = iVar7;
  if (pQVar8 != (QTreeWidgetItem *)0x0) {
    do {
      pQVar10 = pQVar8->par;
      this_00 = pQVar10;
      if (pQVar10 == (QTreeWidgetItem *)0x0) {
        this_00 = pQVar2;
      }
      QTreeWidgetItem::executePendingSort(this_00);
      lVar6 = (this_00->children).d.size;
      if (lVar6 == 0) {
LAB_005bab7e:
        iVar7 = -1;
      }
      else {
        iVar7 = -1;
        lVar9 = 0;
        do {
          if (lVar6 << 3 == lVar9) goto LAB_005bab7e;
          iVar7 = iVar7 + 1;
          plVar1 = (long *)((long)(this_00->children).d.ptr + lVar9);
          lVar9 = lVar9 + 8;
        } while ((QTreeWidgetItem *)*plVar1 != pQVar8);
      }
      local_40 = (QTreeWidgetItemIterator *)CONCAT44(local_40._4_4_,iVar7);
      QtPrivate::QPodArrayOps<int>::emplace<int&>
                ((QPodArrayOps<int> *)&pQVar4->m_parentIndex,0,(int *)&local_40);
      pQVar8 = pQVar10;
    } while (pQVar10 != (QTreeWidgetItem *)0x0);
  }
  if ((this->current != (QTreeWidgetItem *)0x0) &&
     (bVar3 = matchesFlags(this,this->current), !bVar3)) {
    operator++(this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QTreeWidgetItemIterator::QTreeWidgetItemIterator(QTreeWidgetItem *item, IteratorFlags flags)
    : d_ptr(new QTreeWidgetItemIteratorPrivate(
                this, qobject_cast<QTreeModel*>(item->view->model()))),
      current(item), flags(flags)
{
    Q_D(QTreeWidgetItemIterator);
    Q_ASSERT(item);
    QTreeModel *model = qobject_cast<QTreeModel*>(item->view->model());
    Q_ASSERT(model);
    model->iterators.append(this);

    // Initialize m_currentIndex and m_parentIndex as it would be if we had traversed from
    // the beginning.
    QTreeWidgetItem *parent = item;
    parent = parent->parent();
    QTreeWidgetItem *root = d->m_model->rootItem;
    d->m_currentIndex = (parent ? parent : root)->indexOfChild(item);

    while (parent) {
        QTreeWidgetItem *itm = parent;
        parent = parent->parent();
        const int index = (parent ? parent : root)->indexOfChild(itm);
        d->m_parentIndex.prepend(index);
    }

    if (current && !matchesFlags(current))
        ++(*this);
}